

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
MinVR::VRDataIndex::getValueWithDefault<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,VRDataIndex *this,string *key,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultVal,
          string *nameSpace,bool inherit)

{
  iterator iVar1;
  long *plVar2;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)nameSpace);
  iVar1 = _getEntry(this,key,&local_50,inherit);
  std::__cxx11::string::~string((string *)&local_50);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)defaultVal);
  }
  else {
    plVar2 = (long *)(**(code **)(**(long **)(iVar1._M_node + 2) + 0x18))();
    (**(code **)(*plVar2 + 0x10))(__return_storage_ptr__,plVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

T getValueWithDefault(const std::string &key,
                        const T &defaultVal,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      return defaultVal;
    } else {
      return p->second->getValue();
    }
  }